

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.c
# Opt level: O0

EdgeType raviX_get_edge_type(Graph *g,nodeId_t from,nodeId_t to)

{
  GraphNode *pGVar1;
  GraphNodeLink *pGVar2;
  GraphNodeLink *node_link;
  GraphNode *prednode;
  nodeId_t to_local;
  nodeId_t from_local;
  Graph *g_local;
  
  pGVar1 = raviX_get_node(g,from);
  if (pGVar1 == (GraphNode *)0x0) {
    g_local._4_4_ = EDGE_TYPE_UNCLASSIFIED;
  }
  else {
    pGVar2 = node_list_get(&pGVar1->succs,to);
    if (pGVar2 == (GraphNodeLink *)0x0) {
      g_local._4_4_ = EDGE_TYPE_UNCLASSIFIED;
    }
    else {
      g_local._4_4_ = (EdgeType)pGVar2->edge_type;
    }
  }
  return g_local._4_4_;
}

Assistant:

enum EdgeType raviX_get_edge_type(Graph *g, nodeId_t from, nodeId_t to)
{
	GraphNode *prednode = raviX_get_node(g, from);
	if (prednode == NULL)
		return EDGE_TYPE_UNCLASSIFIED;
	struct GraphNodeLink *node_link = node_list_get(&prednode->succs, to);
	if (node_link == NULL)
		return EDGE_TYPE_UNCLASSIFIED;
	return (enum EdgeType) node_link->edge_type;
}